

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

OrdType * __thiscall Application::queryOrdType(OrdType *__return_storage_ptr__,Application *this)

{
  ostream *poVar1;
  exception *this_00;
  char local_19;
  Application *pAStack_18;
  char value;
  Application *this_local;
  
  pAStack_18 = this;
  this_local = (Application *)__return_storage_ptr__;
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"1) Market");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"2) Limit");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"3) Stop");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"4) Stop Limit");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar1,"OrdType: ");
  std::operator>>((istream *)&std::cin,&local_19);
  switch(local_19) {
  case '1':
    FIX::OrdType::OrdType(__return_storage_ptr__,"12340321511Application");
    break;
  case '2':
    FIX::OrdType::OrdType(__return_storage_ptr__,"2340321511Application");
    break;
  case '3':
    FIX::OrdType::OrdType(__return_storage_ptr__,"340321511Application");
    break;
  case '4':
    FIX::OrdType::OrdType(__return_storage_ptr__,"40321511Application");
    break;
  default:
    this_00 = (exception *)__cxa_allocate_exception(8);
    std::exception::exception(this_00);
    __cxa_throw(this_00,&std::exception::typeinfo,std::exception::~exception);
  }
  return __return_storage_ptr__;
}

Assistant:

FIX::OrdType Application::queryOrdType() {
  char value;
  std::cout << std::endl
            << "1) Market" << std::endl
            << "2) Limit" << std::endl
            << "3) Stop" << std::endl
            << "4) Stop Limit" << std::endl
            << "OrdType: ";

  std::cin >> value;
  switch (value) {
  case '1':
    return FIX::OrdType(FIX::OrdType_MARKET);
  case '2':
    return FIX::OrdType(FIX::OrdType_LIMIT);
  case '3':
    return FIX::OrdType(FIX::OrdType_STOP);
  case '4':
    return FIX::OrdType(FIX::OrdType_STOP_LIMIT);
  default:
    throw std::exception();
  }
}